

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__node
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  ENUM__node_enum EVar2;
  node__AttributeData *pnVar3;
  StringHash SVar4;
  long *in_RSI;
  ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
  *in_RDI;
  bool failed_1;
  bool failed;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  node__AttributeData *attributeData;
  ParserChar *in_stack_00000078;
  ParserChar *in_stack_00000080;
  StringHash in_stack_00000088;
  ErrorType in_stack_00000090;
  Severity in_stack_00000094;
  ParserTemplateBase *in_stack_00000098;
  ParserString *in_stack_ffffffffffffff98;
  ParserTemplateBase *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa8;
  byte in_stack_ffffffffffffffae;
  byte in_stack_ffffffffffffffaf;
  bool *failed_00;
  ParserTemplateBase *this_00;
  undefined8 *local_38;
  bool local_1;
  
  pnVar3 = GeneratedSaxParser::ParserTemplateBase::newData<COLLADASaxFWL15::node__AttributeData>
                     (in_stack_ffffffffffffffa0,(void **)in_stack_ffffffffffffff98);
  local_38 = (undefined8 *)*in_RSI;
  if (local_38 == (undefined8 *)0x0) {
LAB_00a01fa2:
    if ((pnVar3->present_attributes & 1) == 0) {
      GeneratedSaxParser::XSList<GeneratedSaxParser::ParserString>::XSList
                ((XSList<GeneratedSaxParser::ParserString> *)&stack0xffffffffffffff98);
      (pnVar3->layer).data = in_stack_ffffffffffffff98;
      (pnVar3->layer).size = (size_t)in_stack_ffffffffffffffa0;
    }
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              this_00 = (ParserTemplateBase *)*local_38;
              if (this_00 == (ParserTemplateBase *)0x0) goto LAB_00a01fa2;
              SVar4 = GeneratedSaxParser::Utils::calculateStringHash((ParserChar *)this_00);
              if (local_38 + 1 == (undefined8 *)0x0) {
                return false;
              }
              failed_00 = (bool *)local_38[1];
              local_38 = local_38 + 2;
              if (SVar4 != 0x6f4) break;
              pnVar3->id = failed_00;
            }
            if (SVar4 != 0x79f4) break;
            pnVar3->sid = failed_00;
          }
          if (SVar4 != 0x74835) break;
          pnVar3->name = failed_00;
        }
        if (SVar4 == 0x7c065) break;
        if (SVar4 == 0x728fc2) {
          bVar1 = GeneratedSaxParser::
                  ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                  ::characterData2StringList
                            (in_RDI,"du",(XSList<GeneratedSaxParser::ParserString> *)0xa01f17);
          in_stack_ffffffffffffffae = (bVar1 ^ 0xffU) & 1;
          if ((in_stack_ffffffffffffffae != 0) &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                (this_00,(Severity)(SVar4 >> 0x20),(ErrorType)SVar4,
                                 (StringHash)failed_00,
                                 (CONCAT17(in_stack_ffffffffffffffaf,
                                           CONCAT16(bVar1,in_stack_ffffffffffffffa8)) ^
                                 0xff000000000000) & 0xff01ffffffffffff,
                                 (ParserChar *)in_stack_ffffffffffffffa0), bVar1)) {
            return false;
          }
          if ((in_stack_ffffffffffffffae & 1) == 0) {
            pnVar3->present_attributes = pnVar3->present_attributes | 1;
          }
        }
        else {
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            (in_stack_00000098,in_stack_00000094,in_stack_00000090,in_stack_00000088
                             ,in_stack_00000080,in_stack_00000078);
          if (bVar1) {
            return false;
          }
        }
      }
      EVar2 = GeneratedSaxParser::Utils::
              toEnum<COLLADASaxFWL15::ENUM__node_enum,_unsigned_long,_(COLLADASaxFWL15::ENUM__node_enum)2>
                        ((ParserChar *)0x7c065,failed_00,
                         (pair<unsigned_long,_COLLADASaxFWL15::ENUM__node_enum> *)
                         CONCAT17(in_stack_ffffffffffffffaf,
                                  CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)),
                         (_func_unsigned_long_ParserChar_ptr_bool_ptr *)in_stack_ffffffffffffffa0);
      pnVar3->type = EVar2;
    } while (((in_stack_ffffffffffffffaf & 1) == 0) ||
            (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                               (this_00,(Severity)(SVar4 >> 0x20),(ErrorType)SVar4,
                                (StringHash)failed_00,
                                CONCAT17(in_stack_ffffffffffffffaf,
                                         CONCAT16(in_stack_ffffffffffffffae,
                                                  in_stack_ffffffffffffffa8)),
                                (ParserChar *)in_stack_ffffffffffffffa0), !bVar1));
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__node( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__node( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

node__AttributeData* attributeData = newData<node__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_ID:
    {

attributeData->id = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_NAME:
    {

attributeData->name = attributeValue;

    break;
    }
    case HASH_ATTRIBUTE_SID:
    {

attributeData->sid = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__sid_type(attributeData->sid, strlen(attributeData->sid));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_NODE,
            HASH_ATTRIBUTE_SID,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_TYPE:
    {
bool failed;
attributeData->type = Utils::toEnum<ENUM__node_enum, StringHash, ENUM__node_enum__COUNT>(attributeValue, failed, ENUM__node_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_NODE,
        HASH_ATTRIBUTE_TYPE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_LAYER:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2StringList(attributeValue, attributeData->layer, &validate__Name, HASH_ELEMENT_NODE, HASH_ATTRIBUTE_LAYER);
    }
    else
    {
failed = !characterData2StringList(attributeValue, attributeData->layer);
    }
#else
    {
failed = !characterData2StringList(attributeValue, attributeData->layer);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_NODE,
        HASH_ATTRIBUTE_LAYER,
        attributeValue))
{
    return false;
}

if ( !failed )
    attributeData->present_attributes |= node__AttributeData::ATTRIBUTE_LAYER_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_NODE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & node__AttributeData::ATTRIBUTE_LAYER_PRESENT) == 0)
{
    attributeData->layer = GeneratedSaxParser::XSList<ParserString>();
}


    return true;
}